

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void __thiscall
QTextCursor::insertImage(QTextCursor *this,QTextImageFormat *format,Position alignment)

{
  QTextDocumentPrivate *this_00;
  uint o;
  int format_00;
  QTextCursorPrivate *pQVar1;
  QTextObject *this_01;
  char *__filename;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QTextCursorPrivate *)0x0) {
    pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    if (pQVar1->priv != (QTextDocumentPrivate *)0x0) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)local_48);
      QTextFrameFormat::setPosition((QTextFrameFormat *)local_48,alignment);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      this_01 = QTextDocumentPrivate::createObject(pQVar1->priv,(QTextFormat *)local_48,-1);
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)local_58,(QTextFormat *)format);
      o = QTextObject::objectIndex(this_01);
      __filename = (char *)(ulong)o;
      QTextFormat::setObjectIndex((QTextFormat *)local_58,o);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextDocumentPrivate::beginEditBlock(pQVar1->priv);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextCursorPrivate::remove(pQVar1,__filename);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      format_00 = QTextFormatCollection::indexForFormat
                            (&pQVar1->priv->formats,(QTextFormat *)local_58);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      this_00 = pQVar1->priv;
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextDocumentPrivate::insert(this_00,pQVar1->position,(QChar)0xfffc,format_00);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextDocumentPrivate::endEditBlock(pQVar1->priv);
      QTextFormat::~QTextFormat((QTextFormat *)local_58);
      QTextFormat::~QTextFormat((QTextFormat *)local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertImage(const QTextImageFormat &format, QTextFrameFormat::Position alignment)
{
    if (!d || !d->priv)
        return;

    QTextFrameFormat ffmt;
    ffmt.setPosition(alignment);
    QTextObject *obj = d->priv->createObject(ffmt);

    QTextImageFormat fmt = format;
    fmt.setObjectIndex(obj->objectIndex());

    d->priv->beginEditBlock();
    d->remove();
    const int idx = d->priv->formatCollection()->indexForFormat(fmt);
    d->priv->insert(d->position, QChar(QChar::ObjectReplacementCharacter), idx);
    d->priv->endEditBlock();
}